

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

HeapLeafObject * __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::findObject
          (Interpreter *this,Identifier *f,HeapObject *curr,uint start_from,uint *counter)

{
  long lVar1;
  HeapLeafObject *pHVar2;
  undefined4 in_register_0000000c;
  uint *puVar3;
  GarbageCollectionMark *pGVar4;
  GarbageCollectionMark *pGVar5;
  uint uVar6;
  GarbageCollectionMark *pGVar7;
  
  puVar3 = (uint *)CONCAT44(in_register_0000000c,start_from);
  if (f != (Identifier *)0x0) {
    do {
      lVar1 = __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                             &(anonymous_namespace)::HeapExtendedObject::typeinfo,0);
      if (lVar1 == 0) {
        uVar6 = *puVar3;
        if (uVar6 < (uint)curr) goto LAB_0017af44;
        pHVar2 = (HeapLeafObject *)
                 __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                                &(anonymous_namespace)::HeapSimpleObject::typeinfo,0);
        if (pHVar2 == (HeapLeafObject *)0x0) {
          pHVar2 = (HeapLeafObject *)
                   __dynamic_cast(f,&(anonymous_namespace)::HeapObject::typeinfo,
                                  &(anonymous_namespace)::HeapComprehensionObject::typeinfo,0);
          if ((pHVar2 == (HeapLeafObject *)0x0) ||
             (pGVar4 = (GarbageCollectionMark *)
                       pHVar2[6].super_HeapObject.super_HeapEntity._vptr_HeapEntity,
             pGVar4 == (GarbageCollectionMark *)0x0)) goto LAB_0017af44;
          pGVar5 = &pHVar2[5].super_HeapObject.super_HeapEntity.mark;
          pGVar7 = pGVar5;
          do {
            if (*(Interpreter **)(pGVar4 + 0x20) >= this) {
              pGVar7 = pGVar4;
            }
            pGVar4 = *(GarbageCollectionMark **)
                      (pGVar4 + (ulong)(*(Interpreter **)(pGVar4 + 0x20) < this) * 8 + 0x10);
          } while (pGVar4 != (GarbageCollectionMark *)0x0);
        }
        else {
          pGVar4 = (GarbageCollectionMark *)
                   pHVar2[5].super_HeapObject.super_HeapEntity._vptr_HeapEntity;
          if (pGVar4 == (GarbageCollectionMark *)0x0) goto LAB_0017af44;
          pGVar5 = &pHVar2[4].super_HeapObject.super_HeapEntity.mark;
          pGVar7 = pGVar5;
          do {
            if (*(Interpreter **)(pGVar4 + 0x20) >= this) {
              pGVar7 = pGVar4;
            }
            pGVar4 = *(GarbageCollectionMark **)
                      (pGVar4 + (ulong)(*(Interpreter **)(pGVar4 + 0x20) < this) * 8 + 0x10);
          } while (pGVar4 != (GarbageCollectionMark *)0x0);
        }
        if ((pGVar7 != pGVar5) && (*(Interpreter **)(pGVar7 + 0x20) <= this)) {
          return pHVar2;
        }
        goto LAB_0017af44;
      }
      pHVar2 = findObject(this,*(Identifier **)(lVar1 + 0x18),
                          (HeapObject *)((ulong)curr & 0xffffffff),start_from,counter);
      if (pHVar2 != (HeapLeafObject *)0x0) {
        return pHVar2;
      }
      f = *(Identifier **)(lVar1 + 0x10);
    } while (f != (Identifier *)0x0);
  }
  uVar6 = *puVar3;
LAB_0017af44:
  *puVar3 = uVar6 + 1;
  return (HeapLeafObject *)0x0;
}

Assistant:

HeapLeafObject *findObject(const Identifier *f, HeapObject *curr, unsigned start_from,
                               unsigned &counter)
    {
        if (auto *ext = dynamic_cast<HeapExtendedObject *>(curr)) {
            auto *r = findObject(f, ext->right, start_from, counter);
            if (r)
                return r;
            auto *l = findObject(f, ext->left, start_from, counter);
            if (l)
                return l;
        } else {
            if (counter >= start_from) {
                if (auto *simp = dynamic_cast<HeapSimpleObject *>(curr)) {
                    auto it = simp->fields.find(f);
                    if (it != simp->fields.end()) {
                        return simp;
                    }
                } else if (auto *comp = dynamic_cast<HeapComprehensionObject *>(curr)) {
                    auto it = comp->compValues.find(f);
                    if (it != comp->compValues.end()) {
                        return comp;
                    }
                }
            }
            counter++;
        }
        return nullptr;
    }